

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaPtr xmlSchemaNewSchema(xmlSchemaParserCtxtPtr ctxt)

{
  xmlSchemaPtr ret;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  ctxt_local = (xmlSchemaParserCtxtPtr)(*xmlMalloc)(0xa0);
  if (ctxt_local == (xmlSchemaParserCtxtPtr)0x0) {
    xmlSchemaPErrMemory(ctxt);
    ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
  }
  else {
    memset(ctxt_local,0,0xa0);
    ctxt_local->am = (xmlAutomataPtr)ctxt->dict;
    xmlDictReference((xmlDictPtr)ctxt_local->am);
  }
  return (xmlSchemaPtr)ctxt_local;
}

Assistant:

static xmlSchemaPtr
xmlSchemaNewSchema(xmlSchemaParserCtxtPtr ctxt)
{
    xmlSchemaPtr ret;

    ret = (xmlSchemaPtr) xmlMalloc(sizeof(xmlSchema));
    if (ret == NULL) {
        xmlSchemaPErrMemory(ctxt);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchema));
    ret->dict = ctxt->dict;
    xmlDictReference(ret->dict);

    return (ret);
}